

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)16>_> *
vkt::api::anon_unknown_1::PipelineLayout::create
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *params)

{
  Move<vk::Handle<(vk::HandleType)16>_> *pMVar1;
  Resources *in_R8;
  long in_R9;
  VkPipelineLayoutCreateInfo pipelineLayoutInfo;
  VkPipelineLayoutCreateInfo local_30;
  
  local_30.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_30.pNext = (void *)0x0;
  local_30.flags = 0;
  local_30.pSetLayouts = (VkDescriptorSetLayout *)res;
  if ((long)params - (long)res == 0) {
    local_30.pSetLayouts = (VkDescriptorSetLayout *)(Resources *)0x0;
  }
  local_30.setLayoutCount = (deUint32)((ulong)((long)params - (long)res) >> 3);
  local_30.pPushConstantRanges = (VkPushConstantRange *)in_R8;
  if (in_R9 - (long)in_R8 == 0) {
    local_30.pPushConstantRanges = (VkPushConstantRange *)(Resources *)0x0;
  }
  local_30.pushConstantRangeCount = (int)((ulong)(in_R9 - (long)in_R8) >> 2) * -0x55555555;
  pMVar1 = ::vk::createPipelineLayout
                     (__return_storage_ptr__,env->vkd,env->device,&local_30,env->allocationCallbacks
                     );
  return pMVar1;
}

Assistant:

static Move<VkPipelineLayout> create (const Environment& env, const Resources& res, const Parameters& params)
	{
		const VkPipelineLayoutCreateInfo	pipelineLayoutInfo	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkPipelineLayoutCreateFlags)0,
			(deUint32)res.pSetLayouts.size(),
			(res.pSetLayouts.empty() ? DE_NULL : &res.pSetLayouts[0]),
			(deUint32)params.pushConstantRanges.size(),
			(params.pushConstantRanges.empty() ? DE_NULL : &params.pushConstantRanges[0]),
		};

		return createPipelineLayout(env.vkd, env.device, &pipelineLayoutInfo, env.allocationCallbacks);
	}